

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void do_express_myself(void)

{
  uchar extraout_RDX [8];
  uchar extraout_RDX_00 [8];
  sockaddr_in addr;
  sockaddr_in addr_00;
  string local_50;
  string str_addr;
  
  fwrite("I am ",5,1,_stderr);
  addr.sin_zero[0] = extraout_RDX[0];
  addr.sin_zero[1] = extraout_RDX[1];
  addr.sin_zero[2] = extraout_RDX[2];
  addr.sin_zero[3] = extraout_RDX[3];
  addr.sin_zero[4] = extraout_RDX[4];
  addr.sin_zero[5] = extraout_RDX[5];
  addr.sin_zero[6] = extraout_RDX[6];
  addr.sin_zero[7] = extraout_RDX[7];
  addr.sin_family = my_addr.sin_family;
  addr.sin_port = my_addr.sin_port;
  addr.sin_addr.s_addr = my_addr.sin_addr.s_addr;
  pack_address_abi_cxx11_(&str_addr,addr);
  fprintf(_stderr,"%s\n",str_addr._M_dataplus._M_p);
  if (flag_root == false) {
    addr_00.sin_zero[0] = extraout_RDX_00[0];
    addr_00.sin_zero[1] = extraout_RDX_00[1];
    addr_00.sin_zero[2] = extraout_RDX_00[2];
    addr_00.sin_zero[3] = extraout_RDX_00[3];
    addr_00.sin_zero[4] = extraout_RDX_00[4];
    addr_00.sin_zero[5] = extraout_RDX_00[5];
    addr_00.sin_zero[6] = extraout_RDX_00[6];
    addr_00.sin_zero[7] = extraout_RDX_00[7];
    addr_00.sin_family = my_addr.sin_family;
    addr_00.sin_port = my_addr.sin_port;
    addr_00.sin_addr.s_addr = my_addr.sin_addr.s_addr;
    pack_address_abi_cxx11_(&local_50,addr_00);
    std::__cxx11::string::operator=((string *)&tosend_address_abi_cxx11_,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    create_new_message(5,id_parent);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str_addr._M_dataplus._M_p != &str_addr.field_2) {
    operator_delete(str_addr._M_dataplus._M_p);
  }
  return;
}

Assistant:

void do_express_myself() {
    fprintf(stderr, "I am ");

    std::string str_addr = pack_address(my_addr);
    fprintf(stderr, "%s\n", str_addr.c_str());

    if (!flag_root) {
        tosend_address = pack_address(my_addr);
        create_new_message(CHILD, id_parent);
    }
}